

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O1

optional<yactfr::ByteOrder> __thiscall yactfr::internal::TsdlAttr::_toBo(TsdlAttr *this)

{
  string *psVar1;
  string msg;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe50;
  TextLocation in_stack_fffffffffffffe58;
  ostringstream local_190 [376];
  
  psVar1 = &this->strVal;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  uVar5 = 1;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        uVar3 = 0x100000000;
        goto LAB_00243f56;
      }
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Invalid byte order `",0x14);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_190,(this->strVal)._M_dataplus._M_p,
                            (this->strVal)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"`.",2);
        std::__cxx11::stringbuf::str();
        if ((this->valLoc).super_type.m_initialized != false) {
          msg.field_2._8_8_ = in_stack_fffffffffffffe50;
          msg._0_24_ = (this->valLoc).super_type.m_storage.dummy_;
          throwTextParseError(msg,in_stack_fffffffffffffe58);
        }
        __assert_fail("valLoc",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-attr.hpp"
                      ,0x70,"TextLocation yactfr::internal::TsdlAttr::valTextLoc() const");
      }
      uVar5 = 0;
    }
  }
  uVar3 = 0;
LAB_00243f56:
  return (optional<yactfr::ByteOrder>)(type)(uVar5 | uVar3);
}

Assistant:

boost::optional<ByteOrder> TsdlAttr::_toBo() const
{
    if (strVal == "be" || strVal == "network") {
        return ByteOrder::Big;
    } else if (strVal == "le") {
        return ByteOrder::Little;
    } else if (strVal == "native") {
        return boost::none;
    }

    std::ostringstream ss;

    ss << "Invalid byte order `" << strVal << "`.";
    throwTextParseError(ss.str(), this->valTextLoc());
}